

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O3

SQInteger __thiscall SQLexer::Lex(SQLexer *this)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  SQInteger SVar4;
  SQInteger c;
  ulong ndelim;
  
  this->_lasttokenline = this->_currentline;
LAB_0011ffd3:
  bVar1 = this->_currdata;
  ndelim = (ulong)bVar1;
  switch(ndelim) {
  case 0:
    goto LAB_0012018f;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 0xb:
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x24:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    goto switchD_0011ffe9_caseD_1;
  case 9:
  case 0xd:
  case 0x20:
    SVar4 = (*this->_readf)(this->_up);
    if (SVar4 < 0x100) {
      if (SVar4 != 0) goto LAB_00120014;
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
LAB_00120014:
      this->_currdata = (LexChar)SVar4;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    goto LAB_0011ffd3;
  case 10:
    this->_currentline = this->_currentline + 1;
    this->_prevtoken = this->_curtoken;
    this->_curtoken = 10;
    SVar4 = (*this->_readf)(this->_up);
    if (SVar4 < 0x100) {
      if (SVar4 != 0) goto LAB_001200bb;
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
LAB_001200bb:
      this->_currdata = (LexChar)SVar4;
    }
    this->_currentcolumn = 1;
    goto LAB_0011ffd3;
  case 0x21:
    SVar4 = (*this->_readf)(this->_up);
    if (SVar4 < 0x100) {
      if (SVar4 == 0) {
        this->_currdata = '\0';
        this->_reached_eof = 1;
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x21;
        break;
      }
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    this->_currdata = (LexChar)SVar4;
    this->_currentcolumn = this->_currentcolumn + 1;
    ndelim = 0x21;
    if ((LexChar)SVar4 == '=') {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      ndelim = 0x109;
    }
    break;
  case 0x22:
  case 0x27:
    goto switchD_0011ffe9_caseD_22;
  case 0x23:
switchD_0011ffe9_caseD_23:
    LexLineComment(this);
    goto LAB_0011ffd3;
  case 0x25:
    SVar4 = (*this->_readf)(this->_up);
    if (SVar4 < 0x100) {
      if (SVar4 == 0) {
        this->_currdata = '\0';
        this->_reached_eof = 1;
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x25;
        break;
      }
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    this->_currdata = (LexChar)SVar4;
    this->_currentcolumn = this->_currentcolumn + 1;
    ndelim = 0x25;
    if ((LexChar)SVar4 == '=') {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      ndelim = 0x13f;
    }
    break;
  case 0x26:
    SVar4 = (*this->_readf)(this->_up);
    if (SVar4 < 0x100) {
      if (SVar4 == 0) {
        this->_currdata = '\0';
        this->_reached_eof = 1;
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x26;
        break;
      }
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    this->_currdata = (LexChar)SVar4;
    this->_currentcolumn = this->_currentcolumn + 1;
    ndelim = 0x26;
    if ((LexChar)SVar4 == '&') {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      ndelim = 0x10e;
    }
    break;
  case 0x28:
  case 0x29:
  case 0x2c:
  case 0x3b:
  case 0x3f:
    goto switchD_0011ffe9_caseD_28;
  case 0x2a:
    SVar4 = (*this->_readf)(this->_up);
    if (SVar4 < 0x100) {
      if (SVar4 == 0) {
        this->_currdata = '\0';
        this->_reached_eof = 1;
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x2a;
        break;
      }
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    this->_currdata = (LexChar)SVar4;
    this->_currentcolumn = this->_currentcolumn + 1;
    ndelim = 0x2a;
    if ((LexChar)SVar4 == '=') {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      ndelim = 0x13d;
    }
    break;
  case 0x2b:
    SVar4 = (*this->_readf)(this->_up);
    if (SVar4 < 0x100) {
      if (SVar4 == 0) {
        this->_currdata = '\0';
        this->_reached_eof = 1;
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x2b;
        break;
      }
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    this->_currdata = (LexChar)SVar4;
    this->_currentcolumn = this->_currentcolumn + 1;
    if ((LexChar)SVar4 == '+') {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      ndelim = 0x12f;
    }
    else {
      ndelim = 0x2b;
      if (((uint)SVar4 & 0xff) == 0x3d) {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x121;
      }
    }
    break;
  case 0x2d:
    SVar4 = (*this->_readf)(this->_up);
    if (SVar4 < 0x100) {
      if (SVar4 == 0) {
        this->_currdata = '\0';
        this->_reached_eof = 1;
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x2d;
        break;
      }
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    this->_currdata = (LexChar)SVar4;
    this->_currentcolumn = this->_currentcolumn + 1;
    if ((LexChar)SVar4 == '-') {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      ndelim = 0x130;
    }
    else {
      ndelim = 0x2d;
      if (((uint)SVar4 & 0xff) == 0x3d) {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x122;
      }
    }
    break;
  case 0x2e:
    SVar4 = (*this->_readf)(this->_up);
    if (SVar4 < 0x100) {
      if (SVar4 == 0) {
        this->_currdata = '\0';
        this->_reached_eof = 1;
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x2e;
        break;
      }
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    this->_currdata = (LexChar)SVar4;
    this->_currentcolumn = this->_currentcolumn + 1;
    ndelim = 0x2e;
    if ((LexChar)SVar4 == '.') {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      if (this->_currdata != '.') {
        (*this->_errfunc)(this->_errtarget,"invalid token \'..\'");
      }
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      ndelim = 0x138;
    }
    break;
  case 0x2f:
    SVar4 = (*this->_readf)(this->_up);
    if (SVar4 < 0x100) {
      if (SVar4 != 0) goto LAB_0012008f;
      this->_currdata = '\0';
      this->_reached_eof = 1;
      this->_currentcolumn = this->_currentcolumn + 1;
LAB_0012080b:
      ndelim = 0x2f;
      break;
    }
    (*this->_errfunc)(this->_errtarget,"Invalid character");
LAB_0012008f:
    this->_currdata = (LexChar)SVar4;
    this->_currentcolumn = this->_currentcolumn + 1;
    uVar2 = (uint)SVar4 & 0xff;
    if (0x2e < uVar2) {
      if (uVar2 == 0x2f) goto switchD_0011ffe9_caseD_23;
      if (uVar2 == 0x3d) {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x13e;
        break;
      }
      if (uVar2 == 0x3e) {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x141;
        break;
      }
      goto LAB_0012080b;
    }
    if (uVar2 != 0x2a) goto LAB_0012080b;
    SVar4 = (*this->_readf)(this->_up);
    if (SVar4 < 0x100) {
      if (SVar4 != 0) goto LAB_001200fe;
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
LAB_001200fe:
      this->_currdata = (LexChar)SVar4;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    LexBlockComment(this);
    goto LAB_0011ffd3;
  case 0x3a:
    SVar4 = (*this->_readf)(this->_up);
    if (SVar4 < 0x100) {
      if (SVar4 == 0) {
        this->_currdata = '\0';
        this->_reached_eof = 1;
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x3a;
        break;
      }
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    this->_currdata = (LexChar)SVar4;
    this->_currentcolumn = this->_currentcolumn + 1;
    ndelim = 0x3a;
    if ((LexChar)SVar4 == ':') {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      ndelim = 299;
    }
    break;
  case 0x3c:
    SVar4 = (*this->_readf)(this->_up);
    if (SVar4 < 0x100) {
      if (SVar4 == 0) {
        this->_currdata = '\0';
        this->_reached_eof = 1;
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x3c;
        break;
      }
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    this->_currdata = (LexChar)SVar4;
    this->_currentcolumn = this->_currentcolumn + 1;
    uVar2 = (uint)SVar4 & 0xff;
    ndelim = 0x3c;
    if (uVar2 < 0x3c) {
      if (uVar2 == 0x2d) {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x119;
      }
      else if (uVar2 == 0x2f) {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x140;
      }
    }
    else if (uVar2 == 0x3c) {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      ndelim = 0x128;
    }
    else if (uVar2 == 0x3d) {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      ndelim = 0x10a;
      if (this->_currdata == '>') {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x131;
      }
    }
    break;
  case 0x3d:
    SVar4 = (*this->_readf)(this->_up);
    if (SVar4 < 0x100) {
      if (SVar4 == 0) {
        this->_currdata = '\0';
        this->_reached_eof = 1;
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x3d;
        break;
      }
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    this->_currdata = (LexChar)SVar4;
    this->_currentcolumn = this->_currentcolumn + 1;
    ndelim = 0x3d;
    if ((LexChar)SVar4 == '=') {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      ndelim = 0x108;
    }
    break;
  case 0x3e:
    SVar4 = (*this->_readf)(this->_up);
    if (SVar4 < 0x100) {
      if (SVar4 == 0) {
        this->_currdata = '\0';
        this->_reached_eof = 1;
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x3e;
        break;
      }
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    this->_currdata = (LexChar)SVar4;
    this->_currentcolumn = this->_currentcolumn + 1;
    if ((LexChar)SVar4 == '>') {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      ndelim = 0x129;
      if (this->_currdata == '>') {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x132;
      }
    }
    else {
      ndelim = 0x3e;
      if (((uint)SVar4 & 0xff) == 0x3d) {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x10b;
      }
    }
    break;
  case 0x40:
    SVar4 = (*this->_readf)(this->_up);
    if (SVar4 < 0x100) {
      if (SVar4 == 0) {
        this->_currdata = '\0';
        this->_reached_eof = 1;
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x40;
        break;
      }
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    this->_currdata = (LexChar)SVar4;
    this->_currentcolumn = this->_currentcolumn + 1;
    ndelim = 0x40;
    if (((LexChar)SVar4 != '\"') ||
       (ndelim = ReadString(this,0x22,true), ndelim != 0xffffffffffffffff)) break;
    (*this->_errfunc)(this->_errtarget,"error parsing the string");
    ndelim = (ulong)this->_currdata;
switchD_0011ffe9_caseD_22:
    ndelim = ReadString(this,ndelim,false);
    if (ndelim != 0xffffffffffffffff) break;
    (*this->_errfunc)(this->_errtarget,"error parsing the string");
    ndelim = (ulong)this->_currdata;
switchD_0011ffe9_caseD_28:
    SVar4 = (*this->_readf)(this->_up);
    if (SVar4 < 0x100) {
      if (SVar4 != 0) goto LAB_0012017d;
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
LAB_0012017d:
      this->_currdata = (LexChar)SVar4;
    }
    goto LAB_00120181;
  default:
    uVar2 = bVar1 - 0x5b;
    if (uVar2 < 0x24) {
      if ((0xd0000000dU >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto switchD_0011ffe9_caseD_28;
      if ((ulong)uVar2 == 0x21) {
        SVar4 = (*this->_readf)(this->_up);
        if (SVar4 < 0x100) {
          if (SVar4 == 0) {
            this->_currdata = '\0';
            this->_reached_eof = 1;
            this->_currentcolumn = this->_currentcolumn + 1;
            ndelim = 0x7c;
            break;
          }
        }
        else {
          (*this->_errfunc)(this->_errtarget,"Invalid character");
        }
        this->_currdata = (LexChar)SVar4;
        this->_currentcolumn = this->_currentcolumn + 1;
        ndelim = 0x7c;
        if ((LexChar)SVar4 == '|') {
          Next(this);
          this->_currentcolumn = this->_currentcolumn + 1;
          ndelim = 0x10f;
        }
        break;
      }
    }
    goto switchD_0011ffe9_caseD_1;
  }
LAB_00120185:
  this->_prevtoken = this->_curtoken;
  this->_curtoken = ndelim;
  return ndelim;
switchD_0011ffe9_caseD_1:
  if (bVar1 - 0x30 < 10) {
    ndelim = ReadNumber(this);
  }
  else {
    iVar3 = isalpha((uint)bVar1);
    if ((bVar1 == 0x5f) || (iVar3 != 0)) {
      ndelim = ReadID(this);
    }
    else {
      iVar3 = iscntrl((uint)bVar1);
      if (iVar3 != 0) {
        (*this->_errfunc)(this->_errtarget,"unexpected character(control)");
      }
      Next(this);
LAB_00120181:
      this->_currentcolumn = this->_currentcolumn + 1;
    }
  }
  goto LAB_00120185;
LAB_0012018f:
  return 0;
}

Assistant:

SQInteger SQLexer::Lex()
{
    _lasttokenline = _currentline;
    while(CUR_CHAR != SQUIRREL_EOB) {
        switch(CUR_CHAR){
        case _SC('\t'): case _SC('\r'): case _SC(' '): NEXT(); continue;
        case _SC('\n'):
            _currentline++;
            _prevtoken=_curtoken;
            _curtoken=_SC('\n');
            NEXT();
            _currentcolumn=1;
            continue;
        case _SC('#'): LexLineComment(); continue;
        case _SC('/'):
            NEXT();
            switch(CUR_CHAR){
            case _SC('*'):
                NEXT();
                LexBlockComment();
                continue;
            case _SC('/'):
                LexLineComment();
                continue;
            case _SC('='):
                NEXT();
                RETURN_TOKEN(TK_DIVEQ);
                continue;
            case _SC('>'):
                NEXT();
                RETURN_TOKEN(TK_ATTR_CLOSE);
                continue;
            default:
                RETURN_TOKEN('/');
            }
        case _SC('='):
            NEXT();
            if (CUR_CHAR != _SC('=')){ RETURN_TOKEN('=') }
            else { NEXT(); RETURN_TOKEN(TK_EQ); }
        case _SC('<'):
            NEXT();
            switch(CUR_CHAR) {
            case _SC('='):
                NEXT();
                if(CUR_CHAR == _SC('>')) {
                    NEXT();
                    RETURN_TOKEN(TK_3WAYSCMP);
                }
                RETURN_TOKEN(TK_LE)
                break;
            case _SC('-'): NEXT(); RETURN_TOKEN(TK_NEWSLOT); break;
            case _SC('<'): NEXT(); RETURN_TOKEN(TK_SHIFTL); break;
            case _SC('/'): NEXT(); RETURN_TOKEN(TK_ATTR_OPEN); break;
            }
            RETURN_TOKEN('<');
        case _SC('>'):
            NEXT();
            if (CUR_CHAR == _SC('=')){ NEXT(); RETURN_TOKEN(TK_GE);}
            else if(CUR_CHAR == _SC('>')){
                NEXT();
                if(CUR_CHAR == _SC('>')){
                    NEXT();
                    RETURN_TOKEN(TK_USHIFTR);
                }
                RETURN_TOKEN(TK_SHIFTR);
            }
            else { RETURN_TOKEN('>') }
        case _SC('!'):
            NEXT();
            if (CUR_CHAR != _SC('=')){ RETURN_TOKEN('!')}
            else { NEXT(); RETURN_TOKEN(TK_NE); }
        case _SC('@'): {
            SQInteger stype;
            NEXT();
            if(CUR_CHAR != _SC('"')) {
                RETURN_TOKEN('@');
            }
            if((stype=ReadString('"',true))!=-1) {
                RETURN_TOKEN(stype);
            }
            Error(_SC("error parsing the string"));
                       }
        case _SC('"'):
        case _SC('\''): {
            SQInteger stype;
            if((stype=ReadString(CUR_CHAR,false))!=-1){
                RETURN_TOKEN(stype);
            }
            Error(_SC("error parsing the string"));
            }
        case _SC('{'): case _SC('}'): case _SC('('): case _SC(')'): case _SC('['): case _SC(']'):
        case _SC(';'): case _SC(','): case _SC('?'): case _SC('^'): case _SC('~'):
            {SQInteger ret = CUR_CHAR;
            NEXT(); RETURN_TOKEN(ret); }
        case _SC('.'):
            NEXT();
            if (CUR_CHAR != _SC('.')){ RETURN_TOKEN('.') }
            NEXT();
            if (CUR_CHAR != _SC('.')){ Error(_SC("invalid token '..'")); }
            NEXT();
            RETURN_TOKEN(TK_VARPARAMS);
        case _SC('&'):
            NEXT();
            if (CUR_CHAR != _SC('&')){ RETURN_TOKEN('&') }
            else { NEXT(); RETURN_TOKEN(TK_AND); }
        case _SC('|'):
            NEXT();
            if (CUR_CHAR != _SC('|')){ RETURN_TOKEN('|') }
            else { NEXT(); RETURN_TOKEN(TK_OR); }
        case _SC(':'):
            NEXT();
            if (CUR_CHAR != _SC(':')){ RETURN_TOKEN(':') }
            else { NEXT(); RETURN_TOKEN(TK_DOUBLE_COLON); }
        case _SC('*'):
            NEXT();
            if (CUR_CHAR == _SC('=')){ NEXT(); RETURN_TOKEN(TK_MULEQ);}
            else RETURN_TOKEN('*');
        case _SC('%'):
            NEXT();
            if (CUR_CHAR == _SC('=')){ NEXT(); RETURN_TOKEN(TK_MODEQ);}
            else RETURN_TOKEN('%');
        case _SC('-'):
            NEXT();
            if (CUR_CHAR == _SC('=')){ NEXT(); RETURN_TOKEN(TK_MINUSEQ);}
            else if  (CUR_CHAR == _SC('-')){ NEXT(); RETURN_TOKEN(TK_MINUSMINUS);}
            else RETURN_TOKEN('-');
        case _SC('+'):
            NEXT();
            if (CUR_CHAR == _SC('=')){ NEXT(); RETURN_TOKEN(TK_PLUSEQ);}
            else if (CUR_CHAR == _SC('+')){ NEXT(); RETURN_TOKEN(TK_PLUSPLUS);}
            else RETURN_TOKEN('+');
        case SQUIRREL_EOB:
            return 0;
        default:{
                if (scisdigit(CUR_CHAR)) {
                    SQInteger ret = ReadNumber();
                    RETURN_TOKEN(ret);
                }
                else if (scisalpha(CUR_CHAR) || CUR_CHAR == _SC('_')) {
                    SQInteger t = ReadID();
                    RETURN_TOKEN(t);
                }
                else {
                    SQInteger c = CUR_CHAR;
                    if (sciscntrl((int)c)) Error(_SC("unexpected character(control)"));
                    NEXT();
                    RETURN_TOKEN(c);
                }
                RETURN_TOKEN(0);
            }
        }
    }
    return 0;
}